

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altsvc.c
# Opt level: O1

char * Curl_alpnid2str(alpnid id)

{
  if (id == ALPN_h1) {
    return "h1";
  }
  if (id != ALPN_h3) {
    if (id == ALPN_h2) {
      return "h2";
    }
    return "";
  }
  return "h3";
}

Assistant:

const char *Curl_alpnid2str(enum alpnid id)
{
  switch(id) {
  case ALPN_h1:
    return "h1";
  case ALPN_h2:
    return "h2";
  case ALPN_h3:
    return H3VERSION;
  default:
    return ""; /* bad */
  }
}